

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O0

void Extra_Truth4VarNPN(unsigned_short **puCanons,char **puPhases,char **puPerms,uchar **puMap)

{
  uchar uVar1;
  byte bVar2;
  uint uVar4;
  uint uVar5;
  unsigned_short *__s;
  char *__s_00;
  char *__s_01;
  uchar *__s_02;
  char **__ptr;
  int iVar6;
  int local_70;
  int local_6c;
  int k;
  int i;
  int nClasses;
  int nFuncs;
  char *uPerms;
  char *uPhases;
  char **pPerms4;
  uint uPerm;
  uint uPhase;
  uint uTruth;
  uchar *uMap;
  unsigned_short *uCanons;
  uchar **puMap_local;
  char **puPerms_local;
  char **puPhases_local;
  unsigned_short **puCanons_local;
  unsigned_short uVar3;
  
  __s = (unsigned_short *)malloc(0x20000);
  __s_00 = (char *)malloc(0x10000);
  __s_01 = (char *)malloc(0x10000);
  __s_02 = (uchar *)malloc(0x10000);
  memset(__s,0,0x20000);
  memset(__s_00,0,0x10000);
  memset(__s_01,0,0x10000);
  memset(__s_02,0,0x10000);
  __ptr = Extra_Permutations(4);
  k = 1;
  uPerm = 1;
  do {
    if (0x7fff < uPerm) {
      __s_00[0xffff] = '\x10';
      if (k != 0xde) {
        __assert_fail("nClasses == 222",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilMisc.c"
                      ,0x2cb,
                      "void Extra_Truth4VarNPN(unsigned short **, char **, char **, unsigned char **)"
                     );
      }
      if (__ptr != (char **)0x0) {
        free(__ptr);
      }
      if (puCanons == (unsigned_short **)0x0) {
        if (__s != (unsigned_short *)0x0) {
          free(__s);
        }
      }
      else {
        *puCanons = __s;
      }
      if (puPhases == (char **)0x0) {
        if (__s_00 != (char *)0x0) {
          free(__s_00);
        }
      }
      else {
        *puPhases = __s_00;
      }
      if (puPerms == (char **)0x0) {
        if (__s_01 != (char *)0x0) {
          free(__s_01);
        }
      }
      else {
        *puPerms = __s_01;
      }
      if (puMap == (uchar **)0x0) {
        if (__s_02 != (uchar *)0x0) {
          free(__s_02);
        }
      }
      else {
        *puMap = __s_02;
      }
      return;
    }
    if (__s[uPerm] == 0) {
      iVar6 = k + 1;
      __s_02[uPerm] = (uchar)k;
      for (local_6c = 0; k = iVar6, local_6c < 0x10; local_6c = local_6c + 1) {
        uVar4 = Extra_TruthPolarize(uPerm,local_6c,4);
        local_70 = 0;
        while( true ) {
          uVar3 = (unsigned_short)uPerm;
          bVar2 = (byte)local_6c;
          if (0x17 < local_70) break;
          uVar5 = Extra_TruthPermute(uVar4,__ptr[local_70],4,0);
          if (__s[uVar5] == 0) {
            __s[uVar5] = uVar3;
            __s_00[uVar5] = bVar2;
            __s_01[uVar5] = (char)local_70;
            uVar5 = (uVar5 ^ 0xffffffff) & 0xffff;
            __s[uVar5] = uVar3;
            __s_00[uVar5] = bVar2 | 0x10;
            __s_01[uVar5] = (char)local_70;
          }
          else if (__s[uVar5] != uPerm) {
            __assert_fail("uCanons[uPerm] == uTruth",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilMisc.c"
                          ,0x2b4,
                          "void Extra_Truth4VarNPN(unsigned short **, char **, char **, unsigned char **)"
                         );
          }
          local_70 = local_70 + 1;
        }
        uVar4 = Extra_TruthPolarize((uPerm ^ 0xffffffff) & 0xffff,local_6c,4);
        for (local_70 = 0; local_70 < 0x18; local_70 = local_70 + 1) {
          uVar5 = Extra_TruthPermute(uVar4,__ptr[local_70],4,0);
          if (__s[uVar5] == 0) {
            __s[uVar5] = uVar3;
            __s_00[uVar5] = bVar2;
            __s_01[uVar5] = (char)local_70;
            uVar5 = (uVar5 ^ 0xffffffff) & 0xffff;
            __s[uVar5] = uVar3;
            __s_00[uVar5] = bVar2 | 0x10;
            __s_01[uVar5] = (char)local_70;
          }
          else if (__s[uVar5] != uPerm) {
            __assert_fail("uCanons[uPerm] == uTruth",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilMisc.c"
                          ,0x2c6,
                          "void Extra_Truth4VarNPN(unsigned short **, char **, char **, unsigned char **)"
                         );
          }
        }
      }
    }
    else {
      if (uPerm <= __s[uPerm]) {
        __assert_fail("uTruth > uCanons[uTruth]",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilMisc.c"
                      ,0x29d,
                      "void Extra_Truth4VarNPN(unsigned short **, char **, char **, unsigned char **)"
                     );
      }
      uVar1 = __s_02[__s[uPerm]];
      __s_02[uPerm] = uVar1;
      __s_02[(uPerm ^ 0xffffffff) & 0xffff] = uVar1;
    }
    uPerm = uPerm + 1;
  } while( true );
}

Assistant:

void Extra_Truth4VarNPN( unsigned short ** puCanons, char ** puPhases, char ** puPerms, unsigned char ** puMap )
{
    unsigned short * uCanons;
    unsigned char * uMap;
    unsigned uTruth, uPhase, uPerm;
    char ** pPerms4, * uPhases, * uPerms;
    int nFuncs, nClasses;
    int i, k;

    nFuncs  = (1 << 16);
    uCanons = ABC_ALLOC( unsigned short, nFuncs );
    uPhases = ABC_ALLOC( char, nFuncs );
    uPerms  = ABC_ALLOC( char, nFuncs );
    uMap    = ABC_ALLOC( unsigned char, nFuncs );
    memset( uCanons, 0, sizeof(unsigned short) * nFuncs );
    memset( uPhases, 0, sizeof(char) * nFuncs );
    memset( uPerms,  0, sizeof(char) * nFuncs );
    memset( uMap,    0, sizeof(unsigned char) * nFuncs );
    pPerms4 = Extra_Permutations( 4 );

    nClasses = 1;
    nFuncs = (1 << 15);
    for ( uTruth = 1; uTruth < (unsigned)nFuncs; uTruth++ )
    {
        // skip already assigned
        if ( uCanons[uTruth] )
        {
            assert( uTruth > uCanons[uTruth] );
            uMap[~uTruth & 0xFFFF] = uMap[uTruth] = uMap[uCanons[uTruth]];
            continue;
        }
        uMap[uTruth] = nClasses++;
        for ( i = 0; i < 16; i++ )
        {
            uPhase = Extra_TruthPolarize( uTruth, i, 4 );
            for ( k = 0; k < 24; k++ )
            {
                uPerm = Extra_TruthPermute( uPhase, pPerms4[k], 4, 0 );
                if ( uCanons[uPerm] == 0 )
                {
                    uCanons[uPerm] = uTruth;
                    uPhases[uPerm] = i;
                    uPerms[uPerm]  = k;

                    uPerm = ~uPerm & 0xFFFF;
                    uCanons[uPerm] = uTruth;
                    uPhases[uPerm] = i | 16;
                    uPerms[uPerm]  = k;
                }
                else
                    assert( uCanons[uPerm] == uTruth );
            }
            uPhase = Extra_TruthPolarize( ~uTruth & 0xFFFF, i, 4 ); 
            for ( k = 0; k < 24; k++ )
            {
                uPerm = Extra_TruthPermute( uPhase, pPerms4[k], 4, 0 );
                if ( uCanons[uPerm] == 0 )
                {
                    uCanons[uPerm] = uTruth;
                    uPhases[uPerm] = i;
                    uPerms[uPerm]  = k;

                    uPerm = ~uPerm & 0xFFFF;
                    uCanons[uPerm] = uTruth;
                    uPhases[uPerm] = i | 16;
                    uPerms[uPerm]  = k;
                }
                else
                    assert( uCanons[uPerm] == uTruth );
            }
        }
    }
    uPhases[(1<<16)-1] = 16;
    assert( nClasses == 222 );
    ABC_FREE( pPerms4 );
    if ( puCanons ) 
        *puCanons = uCanons;
    else
        ABC_FREE( uCanons );
    if ( puPhases ) 
        *puPhases = uPhases;
    else
        ABC_FREE( uPhases );
    if ( puPerms ) 
        *puPerms = uPerms;
    else
        ABC_FREE( uPerms );
    if ( puMap ) 
        *puMap = uMap;
    else
        ABC_FREE( uMap );
}